

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_new.c
# Opt level: O2

LY_ERR lyd_create_any_datatree
                 (ly_ctx *ctx,ly_in *value_in,LYD_ANYDATA_VALUETYPE value_type,ly_bool log,
                 lyd_node **tree)

{
  LY_ERR LVar1;
  undefined7 in_register_00000009;
  lyd_ctx *lydctx;
  uint32_t temp_lo;
  uint32_t *local_38;
  
  lydctx = (lyd_ctx *)0x0;
  temp_lo = 0;
  *tree = (lyd_node *)0x0;
  LVar1 = LY_SUCCESS;
  if ((int)CONCAT71(in_register_00000009,log) == 0) {
    local_38 = ly_temp_log_options(&temp_lo);
  }
  else {
    local_38 = (uint32_t *)0x0;
  }
  switch(value_type) {
  case LYD_ANYDATA_DATATREE:
  case LYD_ANYDATA_STRING:
    ly_log(ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_new.c",
           0x11c);
    return LY_EINT;
  case LYD_ANYDATA_XML:
    LVar1 = lyd_parse_xml(ctx,(lysc_ext_instance *)0x0,(lyd_node *)0x0,tree,value_in,0x50000,0,0x30,
                          (ly_set *)0x0,(ly_bool *)0x0,&lydctx);
    break;
  case LYD_ANYDATA_JSON:
    LVar1 = lyd_parse_json(ctx,(lysc_ext_instance *)0x0,(lyd_node *)0x0,tree,value_in,0x50000,0,0x30
                           ,(ly_set *)0x0,(ly_bool *)0x0,&lydctx);
    break;
  case LYD_ANYDATA_LYB:
    LVar1 = lyd_parse_lyb(ctx,(lysc_ext_instance *)0x0,(lyd_node *)0x0,tree,value_in,0x70000,0,0x30,
                          (ly_set *)0x0,(ly_bool *)0x0,&lydctx);
  }
  if (lydctx != (lyd_ctx *)0x0) {
    (*lydctx->free)(lydctx);
  }
  if (log == '\0') {
    ly_temp_log_options(local_38);
  }
  if (LVar1 == LY_SUCCESS) {
    LVar1 = LY_SUCCESS;
  }
  else if (*tree != (lyd_node *)0x0) {
    lyd_free_siblings(*tree);
    *tree = (lyd_node *)0x0;
  }
  return LVar1;
}

Assistant:

static LY_ERR
lyd_create_any_datatree(const struct ly_ctx *ctx, struct ly_in *value_in, LYD_ANYDATA_VALUETYPE value_type, ly_bool log,
        struct lyd_node **tree)
{
    LY_ERR rc = LY_SUCCESS;
    struct lyd_ctx *lydctx = NULL;
    uint32_t parse_opts, int_opts, *prev_lo = NULL, temp_lo = 0;

    *tree = NULL;

    /* set options */
    parse_opts = LYD_PARSE_ONLY | LYD_PARSE_OPAQ;
    int_opts = LYD_INTOPT_ANY | LYD_INTOPT_WITH_SIBLINGS;

    if (!log) {
        /* no logging */
        prev_lo = ly_temp_log_options(&temp_lo);
    }

    switch (value_type) {
    case LYD_ANYDATA_DATATREE:
    case LYD_ANYDATA_STRING:
        /* unreachable */
        LOGINT_RET(ctx);
    case LYD_ANYDATA_XML:
        rc = lyd_parse_xml(ctx, NULL, NULL, tree, value_in, parse_opts, 0, int_opts, NULL, NULL, &lydctx);
        break;
    case LYD_ANYDATA_JSON:
        rc = lyd_parse_json(ctx, NULL, NULL, tree, value_in, parse_opts, 0, int_opts, NULL, NULL, &lydctx);
        break;
    case LYD_ANYDATA_LYB:
        rc = lyd_parse_lyb(ctx, NULL, NULL, tree, value_in, parse_opts | LYD_PARSE_STRICT, 0, int_opts, NULL, NULL, &lydctx);
        break;
    }
    if (lydctx) {
        lydctx->free(lydctx);
    }

    if (!log) {
        /* restore logging */
        ly_temp_log_options(prev_lo);
    }
    if (rc && *tree) {
        lyd_free_siblings(*tree);
        *tree = NULL;
    }
    return rc;
}